

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> __thiscall
llbuild::core::createSQLiteBuildDB
          (core *this,StringRef path,uint32_t clientSchemaVersion,bool recreateUnmatchedVersion,
          string *error_out)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  pcVar2 = path.Data;
  puVar1 = (undefined8 *)operator_new(0xd8);
  *puVar1 = &PTR__SQLiteBuildDB_001e74c8;
  puVar1[1] = puVar1 + 3;
  if (pcVar2 == (char *)0x0) {
    puVar1[2] = 0;
    *(undefined1 *)(puVar1 + 3) = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar1 + 1),pcVar2,pcVar2 + path.Length);
  }
  *(uint32_t *)(puVar1 + 5) = clientSchemaVersion;
  *(bool *)((long)puVar1 + 0x2c) = recreateUnmatchedVersion;
  memset(puVar1 + 6,0,0x8c);
  puVar1[0x18] = 0;
  puVar1[0x19] = 0;
  *(undefined4 *)(puVar1 + 0x1a) = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
          )(__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<BuildDB> core::createSQLiteBuildDB(StringRef path,
                                                   uint32_t clientSchemaVersion,
                                                   bool recreateUnmatchedVersion,
                                                   std::string *error_out) {
  return llvm::make_unique<SQLiteBuildDB>(path, clientSchemaVersion, recreateUnmatchedVersion);
}